

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

void lj_state_shrinkstack(lua_State *L,MSize used)

{
  uint uVar1;
  uint64_t uVar2;
  
  uVar1 = L->stacksize;
  if ((uVar1 - 0x5f < 0xff86 && used << 2 < uVar1) &&
     ((uVar2 = (L->glref).ptr64, *(long *)(uVar2 + 0x178) == 0 ||
      (*(lua_State **)(uVar2 + 0x170) != L)))) {
    resizestack(L,uVar1 >> 1);
    return;
  }
  return;
}

Assistant:

void lj_state_shrinkstack(lua_State *L, MSize used)
{
  if (L->stacksize > LJ_STACK_MAXEX)
    return;  /* Avoid stack shrinking while handling stack overflow. */
  if (4*used < L->stacksize &&
      2*(LJ_STACK_START+LJ_STACK_EXTRA) < L->stacksize &&
      /* Don't shrink stack of live trace. */
      (tvref(G(L)->jit_base) == NULL || obj2gco(L) != gcref(G(L)->cur_L)))
    resizestack(L, L->stacksize >> 1);
}